

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_common.hpp
# Opt level: O2

void __thiscall
oqpi::global_sync_object<oqpi::posix_mutex>::global_sync_object<bool&>
          (global_sync_object<oqpi::posix_mutex> *this,string *name,
          sync_object_creation_options creationOption,bool *args)

{
  posix_mutex::posix_mutex(&this->super_posix_mutex,name,creationOption,*args);
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  return;
}

Assistant:

global_sync_object(const std::string &name, sync_object_creation_options creationOption, _Args &&...args)
            : _Impl(name, creationOption, std::forward<_Args>(args)...)
            , name_(name)
        {}